

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O1

LispPTR LCGetIVValue(LispPTR object,LispPTR iv)

{
  undefined4 *puVar1;
  ulong uVar2;
  DLword *pDVar3;
  uint uVar4;
  LispPTR LVar5;
  LCIVCacheEntry *pLVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint unaff_R15D;
  
  uVar2 = (ulong)object;
  if (atom_instance == 0) {
    LCinit();
  }
  uVar4 = *(ushort *)((ulong)(object >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  if ((*(uint *)((long)DTDspace + (ulong)uVar4 * 4 + (ulong)(uVar4 << 5)) & 0xfffffff) ==
      atom_instance) {
    if ((object & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
    }
    pDVar3 = Lisp_world;
    uVar4 = *(uint *)(Lisp_world + uVar2 + 2);
    uVar8 = (ulong)(((uVar4 ^ iv) & 0x3ff) << 4);
    puVar1 = (undefined4 *)((long)&LCIVCache->iNames + uVar8);
    if ((*(uint *)((long)&LCIVCache->iNames + uVar8) == uVar4) && (puVar1[1] == iv)) {
      unaff_R15D = (uint)*(ushort *)(puVar1 + 2);
      iVar9 = 0;
      pLVar6 = LCIVCache;
    }
    else {
      uVar7 = *(ushort *)((ulong)(uVar4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
      pLVar6 = (LCIVCacheEntry *)(ulong)uVar7;
      iVar9 = 6;
      if ((short)uVar7 == 5) {
        uVar7 = 0;
        do {
          unaff_R15D = uVar7;
          LVar5 = car(uVar4);
          if (LVar5 == iv) {
            *puVar1 = *(undefined4 *)(pDVar3 + uVar2 + 2);
            puVar1[1] = iv;
            pLVar6 = (LCIVCacheEntry *)(ulong)(unaff_R15D | 0xe0000);
            puVar1[2] = unaff_R15D | 0xe0000;
            iVar9 = 0;
            break;
          }
          uVar4 = cdr(uVar4);
          pLVar6 = (LCIVCacheEntry *)(ulong)uVar4;
          uVar7 = unaff_R15D + 1;
        } while (uVar4 != 0);
      }
    }
    if (iVar9 != 6) {
      if (iVar9 != 0) {
        return (LispPTR)pLVar6;
      }
      uVar4 = *(uint *)(pDVar3 + uVar2 + 4);
      if ((uVar4 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar4);
      }
      uVar7 = *(ushort *)
               ((ulong)(*(uint *)(Lisp_world + (ulong)uVar4 + (long)(int)unaff_R15D * 2) >> 8 &
                       0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
      if ((*(uint *)((long)DTDspace + (ulong)uVar7 * 4 + (ulong)(uVar7 << 5)) & 0xfffffff) !=
          atom_annotatedValue) {
        return *(uint *)(Lisp_world + (ulong)uVar4 + (long)(int)unaff_R15D * 2);
      }
    }
  }
  lcfuncall(atom_GetIVValue_LCUFN,2,3);
  return 0xfffffffe;
}

Assistant:

LispPTR LCGetIVValue(LispPTR object, LispPTR iv) {
  struct LCInstance *objptr;
  LispPTR val;
  int index;

  LC_INIT;
  INSTANCE_OR_PUNT(object, atom_GetIVValue_LCUFN, 2);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  GET_IV_INDEX(objptr, iv, index, goto pnut);
  val = ((LispPTR *)NativeAligned4FromLAddr(objptr->iDescrs))[index];
  if (!LC_TYPEP(val, atom_annotatedValue)) return val;
pnut:
  RETCALL(atom_GetIVValue_LCUFN, 2);
  /*
    return LCGetActiveValue(object,val);
  */
}